

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

UBool anon_unknown.dwarf_1601ea::cleanupDefaultCurrencySpacing(void)

{
  UnicodeSet *pUVar1;
  void *in_RSI;
  
  pUVar1 = (anonymous_namespace)::UNISET_DIGIT;
  if ((anonymous_namespace)::UNISET_DIGIT != (UnicodeSet *)0x0) {
    icu_63::UnicodeSet::~UnicodeSet((anonymous_namespace)::UNISET_DIGIT);
    icu_63::UMemory::operator_delete((UMemory *)pUVar1,in_RSI);
  }
  pUVar1 = (anonymous_namespace)::UNISET_NOTS;
  (anonymous_namespace)::UNISET_DIGIT = (UnicodeSet *)0x0;
  if ((anonymous_namespace)::UNISET_NOTS != (UnicodeSet *)0x0) {
    icu_63::UnicodeSet::~UnicodeSet((anonymous_namespace)::UNISET_NOTS);
    icu_63::UMemory::operator_delete((UMemory *)pUVar1,in_RSI);
  }
  (anonymous_namespace)::UNISET_NOTS = (UnicodeSet *)0x0;
  icu_63::UInitOnce::reset((UInitOnce *)&(anonymous_namespace)::gDefaultCurrencySpacingInitOnce);
  return '\x01';
}

Assistant:

UBool U_CALLCONV cleanupDefaultCurrencySpacing() {
    delete UNISET_DIGIT;
    UNISET_DIGIT = nullptr;
    delete UNISET_NOTS;
    UNISET_NOTS = nullptr;
    gDefaultCurrencySpacingInitOnce.reset();
    return TRUE;
}